

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

SmallVector<unsigned_int,_8UL> * __thiscall
spirv_cross::SmallVector<unsigned_int,_8UL>::operator=
          (SmallVector<unsigned_int,_8UL> *this,SmallVector<unsigned_int,_8UL> *other)

{
  uint *puVar1;
  size_t sVar2;
  uint *puVar3;
  size_t sVar4;
  
  if (this != other) {
    (this->super_VectorView<unsigned_int>).buffer_size = 0;
    reserve(this,(other->super_VectorView<unsigned_int>).buffer_size);
    puVar1 = (other->super_VectorView<unsigned_int>).ptr;
    sVar2 = (other->super_VectorView<unsigned_int>).buffer_size;
    puVar3 = (this->super_VectorView<unsigned_int>).ptr;
    for (sVar4 = 0; sVar2 != sVar4; sVar4 = sVar4 + 1) {
      puVar3[sVar4] = puVar1[sVar4];
    }
    (this->super_VectorView<unsigned_int>).buffer_size = sVar2;
  }
  return this;
}

Assistant:

SmallVector &operator=(const SmallVector &other) SPIRV_CROSS_NOEXCEPT
	{
		if (this == &other)
			return *this;

		clear();
		reserve(other.buffer_size);
		for (size_t i = 0; i < other.buffer_size; i++)
			new (&this->ptr[i]) T(other.ptr[i]);
		this->buffer_size = other.buffer_size;
		return *this;
	}